

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O2

void __thiscall despot::StateVar::~StateVar(StateVar *this)

{
  (this->super_NamedVar).super_Variable._vptr_Variable = (_func_int **)&PTR__StateVar_0019bad0;
  std::__cxx11::string::~string((string *)&this->curr_name_);
  std::__cxx11::string::~string((string *)&this->prev_name_);
  NamedVar::~NamedVar(&this->super_NamedVar);
  return;
}

Assistant:

StateVar::~StateVar() {
}